

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void av1_lowbd_inv_txfm2d_add_h_identity_ssse3
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  ulong uVar1;
  int iVar2;
  int row;
  char *pcVar3;
  code *pcVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  int iVar22;
  ulong uVar23;
  ulong *puVar24;
  int iVar25;
  ulong uVar26;
  __m128i *palVar27;
  int32_t *input_00;
  ulong uVar28;
  byte bVar29;
  int iVar30;
  undefined7 in_register_00000081;
  ulong uVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  uint uVar35;
  long lVar36;
  bool bVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int in_stack_fffffffffffffb68;
  __m128i buf0 [64];
  
  uVar26 = CONCAT71(in_register_00000081,tx_size) & 0xffffffff;
  iVar22 = tx_size_wide[uVar26];
  iVar30 = 0x20;
  if (iVar22 < 0x20) {
    iVar30 = iVar22;
  }
  if (eob < iVar30) {
    iVar32 = eob_fill[eob + -1];
  }
  else {
    iVar32 = iVar30 + -1;
  }
  pcVar3 = av1_inv_txfm_shift_ls[uVar26];
  iVar30 = eob_fill[(eob + -1) / iVar30];
  uVar26 = (ulong)(uint)((int)CONCAT71(in_register_00000081,tx_size) << 2);
  iVar2 = *(int *)((long)tx_size_wide_log2 + uVar26);
  iVar25 = *(int *)((long)tx_size_high_log2 + uVar26);
  row = *(int *)((long)tx_size_high + uVar26);
  uVar33 = iVar32 + 8 >> 3;
  uVar35 = iVar30 + 8 >> 3;
  iVar32 = 0x20;
  if (row < 0x20) {
    iVar32 = row;
  }
  iVar22 = get_rect_tx_log_ratio(iVar22,row);
  bVar29 = (byte)(tx_type - 4) >> 1;
  bVar37 = 5 < (byte)(bVar29 | tx_type << 7);
  bVar29 = 0x18 >> (bVar29 & 0x1f);
  uVar28 = 0;
  uVar26 = (ulong)uVar35;
  if ((int)uVar35 < 1) {
    uVar26 = uVar28;
  }
  pcVar4 = *(code **)((ulong)""[tx_type] * 0x20 + (long)iVar25 * 0x60 + 0x550f40 +
                     (long)lowbd_txfm_all_1d_zeros_idx[iVar30] * 8);
  uVar23 = (long)row - 1;
  if ((bVar29 & 1) != 0 || bVar37) {
    uVar23 = uVar28;
  }
  iVar30 = 0;
  if (0 < row) {
    iVar30 = row;
  }
  uVar31 = (ulong)uVar33;
  if ((int)uVar33 < 1) {
    uVar31 = uVar28;
  }
  for (uVar34 = 0; uVar34 != uVar31; uVar34 = uVar34 + 1) {
    input_00 = input + (int)uVar28;
    for (lVar36 = 0; uVar26 * 0x80 != lVar36; lVar36 = lVar36 + 0x80) {
      palVar27 = (__m128i *)((long)buf0[0] + lVar36);
      iidentity_row_8xn_ssse3
                (palVar27,input_00,iVar32,(int)*pcVar3,iVar2 + -2,iVar22,in_stack_fffffffffffffb68);
      transpose_16bit_8x8(palVar27,palVar27);
      input_00 = input_00 + 8;
    }
    (*pcVar4)(buf0,buf0);
    auVar39 = ZEXT416((uint)(1 << (pcVar3[1] + 0xfU & 0x1f)));
    auVar39 = pshuflw(auVar39,auVar39,0);
    auVar39._4_4_ = auVar39._0_4_;
    auVar39._8_4_ = auVar39._0_4_;
    auVar39._12_4_ = auVar39._0_4_;
    puVar24 = (ulong *)(output + uVar34 * 8);
    palVar27 = buf0 + uVar23;
    iVar25 = iVar30;
    while (bVar38 = iVar25 != 0, iVar25 = iVar25 + -1, bVar38) {
      uVar1 = *puVar24;
      auVar13._8_6_ = 0;
      auVar13._0_8_ = uVar1;
      auVar13[0xe] = (char)(uVar1 >> 0x38);
      auVar14._8_4_ = 0;
      auVar14._0_8_ = uVar1;
      auVar14[0xc] = (char)(uVar1 >> 0x30);
      auVar14._13_2_ = auVar13._13_2_;
      auVar15._8_4_ = 0;
      auVar15._0_8_ = uVar1;
      auVar15._12_3_ = auVar14._12_3_;
      auVar16._8_2_ = 0;
      auVar16._0_8_ = uVar1;
      auVar16[10] = (char)(uVar1 >> 0x28);
      auVar16._11_4_ = auVar15._11_4_;
      auVar17._8_2_ = 0;
      auVar17._0_8_ = uVar1;
      auVar17._10_5_ = auVar16._10_5_;
      auVar18[8] = (char)(uVar1 >> 0x20);
      auVar18._0_8_ = uVar1;
      auVar18._9_6_ = auVar17._9_6_;
      auVar19._7_8_ = 0;
      auVar19._0_7_ = auVar18._8_7_;
      auVar20._1_8_ = SUB158(auVar19 << 0x40,7);
      auVar20[0] = (char)(uVar1 >> 0x18);
      auVar20._9_6_ = 0;
      auVar21._1_10_ = SUB1510(auVar20 << 0x30,5);
      auVar21[0] = (char)(uVar1 >> 0x10);
      auVar21._11_4_ = 0;
      auVar41._3_12_ = SUB1512(auVar21 << 0x20,3);
      auVar41[2] = (char)(uVar1 >> 8);
      auVar41[0] = (byte)uVar1;
      auVar41[1] = 0;
      auVar41[0xf] = 0;
      auVar40 = pmulhrsw((undefined1  [16])*palVar27,auVar39);
      auVar41 = paddsw(auVar40,auVar41);
      sVar5 = auVar41._0_2_;
      sVar6 = auVar41._2_2_;
      sVar7 = auVar41._4_2_;
      sVar8 = auVar41._6_2_;
      sVar9 = auVar41._8_2_;
      sVar10 = auVar41._10_2_;
      sVar11 = auVar41._12_2_;
      sVar12 = auVar41._14_2_;
      *puVar24 = CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar41[0xe] - (0xff < sVar12),
                          CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar41[0xc] - (0xff < sVar11),
                                   CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar41[10] -
                                            (0xff < sVar10),
                                            CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar41[8] -
                                                     (0xff < sVar9),
                                                     CONCAT13((0 < sVar8) * (sVar8 < 0x100) *
                                                              auVar41[6] - (0xff < sVar8),
                                                              CONCAT12((0 < sVar7) * (sVar7 < 0x100)
                                                                       * auVar41[4] - (0xff < sVar7)
                                                                       ,CONCAT11((0 < sVar6) *
                                                                                 (sVar6 < 0x100) *
                                                                                 auVar41[2] -
                                                                                 (0xff < sVar6),
                                                                                 (0 < sVar5) *
                                                                                 (sVar5 < 0x100) *
                                                                                 auVar41[0] -
                                                                                 (0xff < sVar5))))))
                                  ));
      puVar24 = (ulong *)((long)puVar24 + (long)stride);
      palVar27 = (__m128i *)((long)palVar27[-1] + (ulong)(((bVar29 | bVar37) & 1) << 5));
    }
    uVar28 = (ulong)(uint)((int)uVar28 + iVar32 * 8);
  }
  return;
}

Assistant:

void av1_lowbd_inv_txfm2d_add_h_identity_ssse3(const int32_t *input,
                                               uint8_t *output, int stride,
                                               TX_TYPE tx_type, TX_SIZE tx_size,
                                               int eob) {
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  int eobx, eoby;
  get_eobx_eoby_scan_h_identity(&eobx, &eoby, tx_size, eob);
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int buf_size_w_div8 = (eobx + 8) >> 3;
  const int buf_size_h_div8 = (eoby + 8) >> 3;
  const int input_stride = AOMMIN(32, txfm_size_row);
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);

  const int fun_idx = lowbd_txfm_all_1d_zeros_idx[eoby];
  assert(fun_idx < 5);
  const transform_1d_ssse3 col_txfm =
      lowbd_txfm_all_1d_zeros_w8_arr[txh_idx][vitx_1d_tab[tx_type]][fun_idx];

  assert(col_txfm != NULL);

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  for (int i = 0; i < buf_size_w_div8; i++) {
    __m128i buf0[64];
    for (int j = 0; j < buf_size_h_div8; j++) {
      __m128i *buf0_cur = buf0 + j * 8;
      const int32_t *input_cur = input + i * 8 * input_stride + j * 8;
      iidentity_row_8xn_ssse3(buf0_cur, input_cur, input_stride, shift[0], 8,
                              txw_idx, rect_type);
      transpose_16bit_8x8(buf0_cur, buf0_cur);
    }
    col_txfm(buf0, buf0);
    __m128i mshift = _mm_set1_epi16(1 << (15 + shift[1]));
    int k = ud_flip ? (txfm_size_row - 1) : 0;
    const int step = ud_flip ? -1 : 1;
    uint8_t *out = output + 8 * i;
    for (int j = 0; j < txfm_size_row; ++j, k += step) {
      const __m128i v = _mm_loadl_epi64((__m128i const *)(out));
      __m128i res = _mm_mulhrs_epi16(buf0[k], mshift);
      const __m128i u = lowbd_get_recon_8x8_sse2(v, res);
      _mm_storel_epi64((__m128i *)(out), u);
      out += stride;
    }
  }
}